

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.c
# Opt level: O3

size_t add_pair(pExecutor exec)

{
  size_t sVar1;
  GCFlags *pGVar2;
  
  if (exec->atomsCount != 0) {
    pGVar2 = exec->pairsFlags;
    sVar1 = 0;
    do {
      if ((pGVar2[sVar1] & GC_USED) == GC_NONE) goto LAB_00108d20;
      sVar1 = sVar1 + 1;
    } while (exec->atomsCount != sVar1);
  }
  gc_collect(exec);
  if (exec->atomsCount != 0) {
    pGVar2 = exec->pairsFlags;
    sVar1 = 0;
    do {
      if ((pGVar2[sVar1] & GC_USED) == GC_NONE) {
LAB_00108d20:
        pGVar2[sVar1] = GC_USED;
        return sVar1;
      }
      sVar1 = sVar1 + 1;
    } while (exec->atomsCount != sVar1);
  }
  puts("add_pair: out of memory");
  return 0x7fffffff;
}

Assistant:

size_t add_pair(pExecutor exec)
{
    size_t place;
    int res = find_place_for_pair(exec, &place);
    if (res == FIND_PLACE_ERROR)
    {
        // free unused memory and try again
        gc_collect(exec);
        res = find_place_for_pair(exec, &place);
        if (res == FIND_PLACE_ERROR)
        {
            log("add_pair: out of memory");
            return EXPR_ERROR;
        }
    }
    exec->pairsFlags[place] = GC_USED;
    return place;
}